

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Vec_Vec_t * Saig_RefManOrderLiterals(Saig_RefMan_t *p,Vec_Int_t *vVar2PiId,Vec_Int_t *vAssumps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Vec_t *p_00;
  Vec_Int_t *p_01;
  int iPiNum;
  int iFrame;
  int iInput;
  int Entry;
  int i;
  Vec_Int_t *vVar2New;
  Vec_Vec_t *vLits;
  Vec_Int_t *vAssumps_local;
  Vec_Int_t *vVar2PiId_local;
  Saig_RefMan_t *p_local;
  
  p_00 = Vec_VecAlloc(100);
  iVar1 = Saig_ManPiNum(p->pAig);
  p_01 = Vec_IntStartFull(iVar1);
  iInput = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAssumps);
    if (iVar1 <= iInput) {
      Vec_IntFree(p_01);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vAssumps,iInput);
    iVar2 = lit_var(iVar1);
    iVar2 = Vec_IntEntry(vVar2PiId,iVar2);
    if ((iVar2 < 0) || (iVar3 = Aig_ManCiNum(p->pFrames), iVar3 <= iVar2)) break;
    iVar3 = Vec_IntEntry(p->vMapPiF2A,iVar2 << 1);
    Vec_IntEntry(p->vMapPiF2A,iVar2 * 2 + 1);
    iVar2 = Vec_IntEntry(p_01,iVar3);
    if (iVar2 == -1) {
      iVar2 = Vec_VecSize(p_00);
      Vec_IntWriteEntry(p_01,iVar3,iVar2);
    }
    iVar2 = Vec_IntEntry(p_01,iVar3);
    Vec_VecPushInt(p_00,iVar2,iVar1);
    iInput = iInput + 1;
  }
  __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                ,0x1c1,
                "Vec_Vec_t *Saig_RefManOrderLiterals(Saig_RefMan_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Vec_t * Saig_RefManOrderLiterals( Saig_RefMan_t * p, Vec_Int_t * vVar2PiId, Vec_Int_t * vAssumps )
{
    Vec_Vec_t * vLits;
    Vec_Int_t * vVar2New;
    int i, Entry, iInput, iFrame;
    // collect literals
    vLits = Vec_VecAlloc( 100 );
    vVar2New = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
//        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
        if ( Vec_IntEntry( vVar2New, iInput ) == ~0 )
            Vec_IntWriteEntry( vVar2New, iInput, Vec_VecSize(vLits) );
        Vec_VecPushInt( vLits, Vec_IntEntry( vVar2New, iInput ), Entry );
    }
    Vec_IntFree( vVar2New );
    return vLits;
}